

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint8_t __thiscall AmpIO::GetNegativeLimitSwitches(AmpIO *this)

{
  uint32_t uVar1;
  undefined1 local_11;
  uint8_t neglim;
  AmpIO *this_local;
  
  uVar1 = GetDigitalInput(this);
  local_11 = (byte)(uVar1 >> 8) & 0xf;
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x44514c41) {
    uVar1 = GetDigitalInput(this);
    local_11 = local_11 | (byte)((uVar1 & 0xf000000) >> 0x14);
  }
  return local_11;
}

Assistant:

uint8_t AmpIO::GetNegativeLimitSwitches(void) const
{
    uint8_t neglim = static_cast<uint8_t>((this->GetDigitalInput()&0x00000f00)>>8);
    if (GetHardwareVersion() == DQLA_String) {
        neglim |= static_cast<uint8_t>((this->GetDigitalInput()&0x0f000000)>>20);
    }
    return neglim;
}